

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::MatchesFilter(String *name,char *filter)

{
  bool bVar1;
  char *str;
  char *local_28;
  char *cur_pattern;
  char *filter_local;
  String *name_local;
  
  local_28 = filter;
  while( true ) {
    str = String::c_str(name);
    bVar1 = PatternMatchesString(local_28,str);
    if (bVar1) {
      return true;
    }
    local_28 = strchr(local_28,0x3a);
    if (local_28 == (char *)0x0) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool UnitTestOptions::MatchesFilter(const String& name, const char* filter) {
  const char *cur_pattern = filter;
  for (;;) {
    if (PatternMatchesString(cur_pattern, name.c_str())) {
      return true;
    }

    // Finds the next pattern in the filter.
    cur_pattern = strchr(cur_pattern, ':');

    // Returns if no more pattern can be found.
    if (cur_pattern == NULL) {
      return false;
    }

    // Skips the pattern separater (the ':' character).
    cur_pattern++;
  }
}